

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::BinaryOp_x86_avx::forward_inplace(BinaryOp_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  _func_int *p_Var3;
  undefined1 auVar4 [32];
  __m256 afVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  __m256 *pafVar9;
  __m128 *pafVar10;
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [16];
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar27 [56];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float in_register_000012dc;
  __m128 afVar44;
  binary_op_pow_pack8 op;
  __m256 _b;
  binary_op_pow_pack8 local_bd;
  int local_bc;
  long local_b8;
  long local_b0;
  Mat *local_a8;
  __m256 local_a0;
  __m256 local_80 [2];
  
  afVar5 = local_80[0];
  local_a8 = bottom_top_blob;
  if (bottom_top_blob->elempack == 4) {
    p_Var3 = this->_vptr_BinaryOp_x86_avx[-3];
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var3)) {
    case 0:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar28._0_4_ = fVar2 + *(float *)*pauVar12;
              auVar28._4_4_ = fVar2 + *(float *)((long)*pauVar12 + 4);
              auVar28._8_4_ = fVar2 + *(float *)((long)*pauVar12 + 8);
              auVar28._12_4_ = fVar2 + *(float *)((long)*pauVar12 + 0xc);
              *pauVar12 = auVar28;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 1:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar20 = vsubps_avx(*pauVar12,auVar18);
              *pauVar12 = auVar20;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 2:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar29._0_4_ = fVar2 * *(float *)*pauVar12;
              auVar29._4_4_ = fVar2 * *(float *)((long)*pauVar12 + 4);
              auVar29._8_4_ = fVar2 * *(float *)((long)*pauVar12 + 8);
              auVar29._12_4_ = fVar2 * *(float *)((long)*pauVar12 + 0xc);
              *pauVar12 = auVar29;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 3:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        auVar16._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var3);
        auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar20 = vshufps_avx(auVar16,auVar16,0);
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar30._0_4_ = auVar20._0_4_ * *(float *)*pauVar12;
              auVar30._4_4_ = auVar20._4_4_ * *(float *)((long)*pauVar12 + 4);
              auVar30._8_4_ = auVar20._8_4_ * *(float *)((long)*pauVar12 + 8);
              auVar30._12_4_ = auVar20._12_4_ * *(float *)((long)*pauVar12 + 0xc);
              *pauVar12 = auVar30;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 4:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar20 = vmaxps_avx(auVar15,*pauVar12);
              *pauVar12 = auVar20;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 5:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar20 = vminps_avx(auVar19,*pauVar12);
              *pauVar12 = auVar20;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 6:
      local_80[0][1] = *(float *)(&this->field_0xd8 + (long)p_Var3);
      local_80[0][0] = local_80[0][1];
      local_80[0][2] = local_80[0][1];
      local_80[0][3] = local_80[0][1];
      local_b0 = (long)bottom_top_blob->c;
      local_bc = bottom_top_blob->h * bottom_top_blob->w;
      local_80[0]._16_16_ = afVar5._16_16_;
      if (0 < local_b0) {
        local_b8 = 0;
        do {
          if (0 < local_bc) {
            pafVar10 = (__m128 *)
                       (local_a8->cstep * local_b8 * local_a8->elemsize + (long)local_a8->data);
            iVar6 = local_bc;
            do {
              auVar27 = ZEXT856(*(ulong *)(*pafVar10 + 2));
              local_a0._0_16_ = (undefined1  [16])*pafVar10;
              afVar44 = binary_op_pow_pack4::operator()
                                  ((binary_op_pow_pack4 *)&local_bd,(__m128 *)local_a0,
                                   (__m128 *)local_80);
              auVar26._0_8_ = afVar44._0_8_;
              auVar26._8_56_ = auVar27;
              afVar44 = auVar26._0_16_;
              local_a0[0] = afVar44[0];
              local_a0[1] = afVar44[1];
              local_a0[2] = afVar44[2];
              local_a0[3] = afVar44[3];
              *pafVar10 = afVar44;
              pafVar10 = pafVar10 + 1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_b0);
      }
      break;
    case 7:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar20 = vsubps_avx(auVar17,*pauVar12);
              *pauVar12 = auVar20;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 8:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
        auVar20._4_4_ = fVar2;
        auVar20._0_4_ = fVar2;
        auVar20._8_4_ = fVar2;
        auVar20._12_4_ = fVar2;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar17 = *pauVar12;
              auVar19 = vrcpps_avx(auVar17);
              fVar37 = fVar2 * auVar19._0_4_;
              fVar38 = fVar2 * auVar19._4_4_;
              fVar39 = fVar2 * auVar19._8_4_;
              fVar40 = fVar2 * auVar19._12_4_;
              auVar31._0_4_ = auVar17._0_4_ * fVar37;
              auVar31._4_4_ = auVar17._4_4_ * fVar38;
              auVar31._8_4_ = auVar17._8_4_ * fVar39;
              auVar31._12_4_ = auVar17._12_4_ * fVar40;
              auVar17 = vsubps_avx(auVar20,auVar31);
              auVar32._0_4_ = fVar37 + auVar19._0_4_ * auVar17._0_4_;
              auVar32._4_4_ = fVar38 + auVar19._4_4_ * auVar17._4_4_;
              auVar32._8_4_ = fVar39 + auVar19._8_4_ * auVar17._8_4_;
              auVar32._12_4_ = fVar40 + auVar19._12_4_ * auVar17._12_4_;
              *pauVar12 = auVar32;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    default:
      goto switchD_002713a4_default;
    }
    goto LAB_00271731;
  }
  if (bottom_top_blob->elempack == 8) {
    p_Var3 = this->_vptr_BinaryOp_x86_avx[-3];
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var3)) {
    case 0:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar33._0_4_ = fVar2 + *(float *)*pauVar11;
              auVar33._4_4_ = fVar2 + *(float *)((long)*pauVar11 + 4);
              auVar33._8_4_ = fVar2 + *(float *)((long)*pauVar11 + 8);
              auVar33._12_4_ = fVar2 + *(float *)((long)*pauVar11 + 0xc);
              auVar33._16_4_ = fVar2 + *(float *)((long)*pauVar11 + 0x10);
              auVar33._20_4_ = fVar2 + *(float *)((long)*pauVar11 + 0x14);
              auVar33._24_4_ = fVar2 + *(float *)((long)*pauVar11 + 0x18);
              auVar33._28_4_ = fVar2 + *(float *)((long)*pauVar11 + 0x1c);
              *pauVar11 = auVar33;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 1:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar23._4_4_ = uVar1;
        auVar23._0_4_ = uVar1;
        auVar23._8_4_ = uVar1;
        auVar23._12_4_ = uVar1;
        auVar23._16_4_ = uVar1;
        auVar23._20_4_ = uVar1;
        auVar23._24_4_ = uVar1;
        auVar23._28_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar25 = vsubps_avx(*pauVar11,auVar23);
              *pauVar11 = auVar25;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 2:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar35._0_4_ = fVar2 * *(float *)*pauVar11;
              auVar35._4_4_ = fVar2 * *(float *)((long)*pauVar11 + 4);
              auVar35._8_4_ = fVar2 * *(float *)((long)*pauVar11 + 8);
              auVar35._12_4_ = fVar2 * *(float *)((long)*pauVar11 + 0xc);
              auVar35._16_4_ = fVar2 * *(float *)((long)*pauVar11 + 0x10);
              auVar35._20_4_ = fVar2 * *(float *)((long)*pauVar11 + 0x14);
              auVar35._28_36_ = in_ZMM1._28_36_;
              auVar35._24_4_ = fVar2 * *(float *)((long)*pauVar11 + 0x18);
              in_ZMM1 = ZEXT3264(auVar35._0_32_);
              *pauVar11 = auVar35._0_32_;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 3:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        auVar14._0_4_ = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var3);
        auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar20 = vshufps_avx(auVar14,auVar14,0);
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar36._0_4_ = auVar20._0_4_ * *(float *)*pauVar11;
              auVar36._4_4_ = auVar20._4_4_ * *(float *)((long)*pauVar11 + 4);
              auVar36._8_4_ = auVar20._8_4_ * *(float *)((long)*pauVar11 + 8);
              auVar36._12_4_ = auVar20._12_4_ * *(float *)((long)*pauVar11 + 0xc);
              auVar36._16_4_ = auVar20._0_4_ * *(float *)((long)*pauVar11 + 0x10);
              auVar36._20_4_ = auVar20._4_4_ * *(float *)((long)*pauVar11 + 0x14);
              auVar36._28_36_ = in_ZMM1._28_36_;
              auVar36._24_4_ = auVar20._8_4_ * *(float *)((long)*pauVar11 + 0x18);
              in_ZMM1 = ZEXT3264(auVar36._0_32_);
              *pauVar11 = auVar36._0_32_;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 4:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar21._4_4_ = uVar1;
        auVar21._0_4_ = uVar1;
        auVar21._8_4_ = uVar1;
        auVar21._12_4_ = uVar1;
        auVar21._16_4_ = uVar1;
        auVar21._20_4_ = uVar1;
        auVar21._24_4_ = uVar1;
        auVar21._28_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar25 = vmaxps_avx(auVar21,*pauVar11);
              *pauVar11 = auVar25;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 5:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar24._4_4_ = uVar1;
        auVar24._0_4_ = uVar1;
        auVar24._8_4_ = uVar1;
        auVar24._12_4_ = uVar1;
        auVar24._16_4_ = uVar1;
        auVar24._20_4_ = uVar1;
        auVar24._24_4_ = uVar1;
        auVar24._28_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar25 = vminps_avx(auVar24,*pauVar11);
              *pauVar11 = auVar25;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 6:
      fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
      local_80[0][1] = fVar2;
      local_80[0][0] = fVar2;
      local_80[0][2] = fVar2;
      local_80[0][3] = fVar2;
      local_80[0][4] = fVar2;
      local_80[0][5] = fVar2;
      local_80[0][6] = fVar2;
      local_80[0][7] = fVar2;
      local_b0 = (long)bottom_top_blob->c;
      local_bc = bottom_top_blob->h * bottom_top_blob->w;
      if (0 < local_b0) {
        local_b8 = 0;
        do {
          if (0 < local_bc) {
            pafVar9 = (__m256 *)
                      (local_a8->cstep * local_b8 * local_a8->elemsize + (long)local_a8->data);
            iVar6 = local_bc;
            do {
              local_a0 = *pafVar9;
              binary_op_pow_pack8::operator()(&local_bd,&local_a0,local_80);
              *pafVar9 = local_a0;
              pafVar9 = pafVar9 + 1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_b0);
      }
      break;
    case 7:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var3);
        auVar22._4_4_ = uVar1;
        auVar22._0_4_ = uVar1;
        auVar22._8_4_ = uVar1;
        auVar22._12_4_ = uVar1;
        auVar22._16_4_ = uVar1;
        auVar22._20_4_ = uVar1;
        auVar22._24_4_ = uVar1;
        auVar22._28_4_ = uVar1;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar25 = vsubps_avx(auVar22,*pauVar11);
              *pauVar11 = auVar25;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    case 8:
      iVar6 = bottom_top_blob->c;
      if (0 < (long)iVar6) {
        iVar8 = bottom_top_blob->h * bottom_top_blob->w;
        fVar2 = *(float *)(&this->field_0xd8 + (long)p_Var3);
        auVar25._4_4_ = fVar2;
        auVar25._0_4_ = fVar2;
        auVar25._8_4_ = fVar2;
        auVar25._12_4_ = fVar2;
        auVar25._16_4_ = fVar2;
        auVar25._20_4_ = fVar2;
        auVar25._24_4_ = fVar2;
        auVar25._28_4_ = fVar2;
        lVar7 = 0;
        do {
          if (0 < iVar8) {
            pauVar11 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar8;
            do {
              auVar22 = *pauVar11;
              auVar24 = vrcpps_avx(auVar22);
              fVar37 = fVar2 * auVar24._0_4_;
              fVar38 = fVar2 * auVar24._4_4_;
              fVar39 = fVar2 * auVar24._8_4_;
              fVar40 = fVar2 * auVar24._12_4_;
              fVar41 = fVar2 * auVar24._16_4_;
              fVar42 = fVar2 * auVar24._20_4_;
              fVar43 = fVar2 * auVar24._24_4_;
              auVar4._4_4_ = auVar22._4_4_ * fVar38;
              auVar4._0_4_ = auVar22._0_4_ * fVar37;
              auVar4._8_4_ = auVar22._8_4_ * fVar39;
              auVar4._12_4_ = auVar22._12_4_ * fVar40;
              auVar4._16_4_ = auVar22._16_4_ * fVar41;
              auVar4._20_4_ = auVar22._20_4_ * fVar42;
              auVar4._24_4_ = auVar22._24_4_ * fVar43;
              auVar4._28_4_ = auVar22._28_4_;
              auVar22 = vsubps_avx(auVar25,auVar4);
              auVar34._0_4_ = fVar37 + auVar24._0_4_ * auVar22._0_4_;
              auVar34._4_4_ = fVar38 + auVar24._4_4_ * auVar22._4_4_;
              auVar34._8_4_ = fVar39 + auVar24._8_4_ * auVar22._8_4_;
              auVar34._12_4_ = fVar40 + auVar24._12_4_ * auVar22._12_4_;
              auVar34._16_4_ = fVar41 + auVar24._16_4_ * auVar22._16_4_;
              auVar34._20_4_ = fVar42 + auVar24._20_4_ * auVar22._20_4_;
              auVar34._24_4_ = fVar43 + auVar24._24_4_ * auVar22._24_4_;
              auVar34._28_4_ = in_register_000012dc + auVar22._28_4_;
              *pauVar11 = auVar34;
              pauVar11 = pauVar11 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != iVar6);
      }
      break;
    default:
      goto switchD_002713a4_default;
    }
LAB_00271731:
    iVar6 = 0;
  }
  else {
switchD_002713a4_default:
    iVar6 = BinaryOp::forward_inplace
                      ((BinaryOp *)
                       ((long)&this->_vptr_BinaryOp_x86_avx + (long)this->_vptr_BinaryOp_x86_avx[-3]
                       ),bottom_top_blob,opt);
  }
  return iVar6;
}

Assistant:

int BinaryOp_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}